

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O0

void __thiscall Sms_Square::run(Sms_Square *this,blip_time_t time,blip_time_t end_time)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int delta_1;
  Blip_Buffer *output;
  int delta;
  int amp;
  int count;
  int in_stack_ffffffffffffffb8;
  blip_time_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_c;
  
  if ((*(int *)(in_RDI + 0x34) == 0) || (*(int *)(in_RDI + 0x38) < 0x81)) {
    if (*(int *)(in_RDI + 0x30) != 0) {
      Blip_Synth<12,_1>::offset
                ((Blip_Synth<12,_1> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,(Blip_Buffer *)0x972e99);
      *(undefined4 *)(in_RDI + 0x30) = 0;
    }
    iVar2 = *(int *)(in_RDI + 0x2c) + in_ESI;
    local_c = in_EDX;
    if ((*(int *)(in_RDI + 0x38) != 0) && (local_c = iVar2, iVar2 < in_EDX)) {
      iVar1 = ((in_EDX - iVar2) + *(int *)(in_RDI + 0x38) + -1) / *(int *)(in_RDI + 0x38);
      *(uint *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) + iVar1 & 1;
      local_c = iVar1 * *(int *)(in_RDI + 0x38) + iVar2;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x3c) == 0) {
      iVar2 = -*(int *)(in_RDI + 0x34);
    }
    else {
      iVar2 = *(int *)(in_RDI + 0x34);
    }
    if (iVar2 != *(int *)(in_RDI + 0x30)) {
      *(int *)(in_RDI + 0x30) = iVar2;
      Blip_Synth<12,_1>::offset
                ((Blip_Synth<12,_1> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,(Blip_Buffer *)0x972f75);
    }
    local_c = *(int *)(in_RDI + 0x2c) + in_ESI;
    if (local_c < in_EDX) {
      do {
        Blip_Synth<12,_1>::offset_inline
                  ((Blip_Synth<12,_1> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,(Blip_Buffer *)0x972fd0);
        local_c = *(int *)(in_RDI + 0x38) + local_c;
        *(uint *)(in_RDI + 0x3c) = *(uint *)(in_RDI + 0x3c) ^ 1;
      } while (local_c < in_EDX);
      if (*(int *)(in_RDI + 0x3c) == 0) {
        iVar2 = -*(int *)(in_RDI + 0x34);
      }
      else {
        iVar2 = *(int *)(in_RDI + 0x34);
      }
      *(int *)(in_RDI + 0x30) = iVar2;
    }
  }
  *(int *)(in_RDI + 0x2c) = local_c - in_EDX;
  return;
}

Assistant:

void Sms_Square::run( blip_time_t time, blip_time_t end_time )
{
	if ( !volume || period <= 128 )
	{
		// ignore 16kHz and higher
		if ( last_amp )
		{
			synth->offset( time, -last_amp, output );
			last_amp = 0;
		}
		time += delay;
		if ( !period )
		{
			time = end_time;
		}
		else if ( time < end_time )
		{
			// keep calculating phase
			int count = (end_time - time + period - 1) / period;
			phase = (phase + count) & 1;
			time += count * period;
		}
	}
	else
	{
		int amp = phase ? volume : -volume;
		{
			int delta = amp - last_amp;
			if ( delta )
			{
				last_amp = amp;
				synth->offset( time, delta, output );
			}
		}
		
		time += delay;
		if ( time < end_time )
		{
			Blip_Buffer* const output = this->output;
			int delta = amp * 2;
			do
			{
				delta = -delta;
				synth->offset_inline( time, delta, output );
				time += period;
				phase ^= 1;
			}
			while ( time < end_time );
			this->last_amp = phase ? volume : -volume;
		}
	}
	delay = time - end_time;
}